

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.hpp
# Opt level: O0

cx_string<7UL>
mserialize::detail::
BuiltinTag<std::tuple<int,_bool,_char,_std::vector<int,_std::allocator<int>_>_>,_void>::tag_string
          (void)

{
  cx_string<2UL> cVar1;
  cx_string<7UL> cVar2;
  cx_string<1UL> *in_stack_00000080;
  cx_string<2UL> *in_stack_00000088;
  cx_string<1UL> *in_stack_00000090;
  cx_string<1UL> *in_stack_00000098;
  cx_string<1UL> *in_stack_000000a0;
  cx_string<1UL> *in_stack_000000a8;
  undefined3 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffeb;
  undefined2 in_stack_ffffffffffffffed;
  undefined1 in_stack_ffffffffffffffef;
  
  make_cx_string<2UL>((char (*) [2])
                      CONCAT17(in_stack_ffffffffffffffef,
                               CONCAT25(in_stack_ffffffffffffffed,
                                        CONCAT23(in_stack_ffffffffffffffeb,in_stack_ffffffffffffffe8
                                                ))));
  BuiltinTag<int,_void>::tag_string();
  BuiltinTag<bool,_void>::tag_string();
  BuiltinTag<char,_void>::tag_string();
  cVar1 = BuiltinTag<std::vector<int,_std::allocator<int>_>,_void>::tag_string();
  make_cx_string<2UL>((char (*) [2])
                      CONCAT17(cVar1._data[2],
                               CONCAT25(cVar1._data._0_2_,
                                        CONCAT23(in_stack_ffffffffffffffeb,in_stack_ffffffffffffffe8
                                                ))));
  cVar2 = cx_strcat<1ul,1ul,1ul,1ul,2ul,1ul>
                    (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                     in_stack_00000088,in_stack_00000080);
  cVar2._data[0] = cVar2._data[0];
  cVar2._data[1] = cVar2._data[1];
  cVar2._data[2] = cVar2._data[2];
  cVar2._data[3] = cVar2._data[3];
  cVar2._data[4] = cVar2._data[4];
  cVar2._data[5] = cVar2._data[5];
  cVar2._data[6] = cVar2._data[6];
  cVar2._data[7] = cVar2._data[7];
  return (cx_string<7UL>)cVar2._data;
}

Assistant:

static constexpr auto tag_string()
  {
    return cx_strcat(
      make_cx_string("("),
      Tag<E>::type::tag_string()...,
      make_cx_string(")")
    );
  }